

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.h
# Opt level: O2

bool __thiscall cmake::IsAKnownSourceExtension(cmake *this,string_view ext)

{
  bool bVar1;
  
  bVar1 = FileExtensions::Test(&this->CLikeSourceFileExtensions,ext);
  if (!bVar1) {
    bVar1 = FileExtensions::Test(&this->CudaFileExtensions,ext);
    if (!bVar1) {
      bVar1 = FileExtensions::Test(&this->FortranFileExtensions,ext);
      if (!bVar1) {
        bVar1 = FileExtensions::Test(&this->HipFileExtensions,ext);
        if (!bVar1) {
          bVar1 = FileExtensions::Test(&this->ISPCFileExtensions,ext);
          return bVar1;
        }
      }
    }
  }
  return true;
}

Assistant:

bool IsAKnownSourceExtension(cm::string_view ext) const
  {
    return this->CLikeSourceFileExtensions.Test(ext) ||
      this->CudaFileExtensions.Test(ext) ||
      this->FortranFileExtensions.Test(ext) ||
      this->HipFileExtensions.Test(ext) || this->ISPCFileExtensions.Test(ext);
  }